

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForTorCorrFunc.cpp
# Opt level: O2

Mat3x3d * __thiscall
OpenMD::ForTorCorrFunc::calcCorrVal
          (Mat3x3d *__return_storage_ptr__,ForTorCorrFunc *this,int frame1,int frame2,int id1,
          int id2)

{
  outProduct<double>(__return_storage_ptr__,
                     (Vector3<double> *)
                     ((long)id1 * 0x18 +
                     *(long *)&(this->forces_).
                               super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[frame1].
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data),
                     (Vector3<double> *)
                     ((long)id2 * 0x18 +
                     *(long *)&(this->torques_).
                               super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[frame2].
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data));
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d ForTorCorrFunc::calcCorrVal(int frame1, int frame2, int id1,
                                      int id2) {
    return outProduct(forces_[frame1][id1], torques_[frame2][id2]);
  }